

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O0

ssize_t __thiscall
llama_io_write_buffer::write(llama_io_write_buffer *this,int __fd,void *__buf,size_t __n)

{
  runtime_error *this_00;
  undefined4 in_register_00000034;
  
  if ((void *)this->buf_size < __buf) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"unexpectedly reached end of buffer");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  memcpy(this->ptr,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf);
  this->ptr = (uint8_t *)((long)__buf + (long)this->ptr);
  this->size_written = (long)__buf + this->size_written;
  this->buf_size = this->buf_size - (long)__buf;
  return (ssize_t)this;
}

Assistant:

void write(const void * src, size_t size) override {
        if (size > buf_size) {
            throw std::runtime_error("unexpectedly reached end of buffer");
        }
        memcpy(ptr, src, size);
        ptr += size;
        size_written += size;
        buf_size -= size;
    }